

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotDigitalEx<ImPlot::GetterXsYs<signed_char>>
               (char *label_id,GetterXsYs<signed_char> getter)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImPlotContext *pIVar3;
  bool bVar4;
  ImU32 col;
  ImDrawList *this;
  ImPlotNextItemData *pIVar5;
  float rhs;
  float fVar6;
  double dVar7;
  ImVec2 IVar8;
  float local_98;
  double local_88;
  int in;
  int pixY_Offset;
  ImVec2 pMax;
  ImVec2 pMin;
  int pixY_chPosOffset;
  int pixY_1;
  float pixY_1_float;
  int pixY_0;
  ImPlotPoint itemData2;
  undefined1 auStack_40 [4];
  int i;
  ImPlotPoint itemData1;
  int pixYMax;
  int y_axis;
  ImPlotNextItemData *s;
  ImDrawList *DrawList;
  ImPlotContext *gp;
  char *label_id_local;
  
  bVar4 = BeginItem(label_id,1);
  pIVar3 = GImPlot;
  if (bVar4) {
    this = GetPlotDrawList();
    pIVar5 = GetItemData();
    if ((1 < getter.Count) && ((pIVar5->RenderFill & 1U) != 0)) {
      itemData1.y._4_4_ = GetCurrentYAxis();
      itemData1.y._0_4_ = 0;
      _auStack_40 = GetterXsYs<signed_char>::operator()(&getter,0);
      for (itemData2.y._4_4_ = 0; itemData2.y._4_4_ < getter.Count;
          itemData2.y._4_4_ = itemData2.y._4_4_ + 1) {
        _pixY_1_float = GetterXsYs<signed_char>::operator()(&getter,itemData2.y._4_4_);
        bVar4 = ImNanOrInf(itemData1.x);
        if (!bVar4) {
          bVar4 = ImNanOrInf(itemData2.x);
          if (bVar4) {
            dVar7 = ImConstrainInf(itemData2.x);
            dVar7 = ImConstrainNan(dVar7);
            itemData2.x = dVar7;
          }
          fVar2 = pIVar5->LineWeight;
          dVar7 = ImMax<double>(0.0,itemData1.x);
          itemData1.x = dVar7;
          rhs = pIVar5->DigitalBitHeight * (float)dVar7;
          fVar6 = ImMax<float>(pIVar5->DigitalBitHeight,rhs);
          itemData1.y._0_4_ = ImMax<int>(itemData1.y._0_4_,(int)(fVar6 + pIVar5->DigitalBitGap));
          pMax = PlotToPixels((ImPlotPoint *)auStack_40,-1);
          IVar8 = PlotToPixels((ImPlotPoint *)&pixY_1_float,-1);
          pMax.y = pIVar3->PixelRange[itemData1.y._4_4_].Min.y +
                   (float)(-0x14 - pIVar3->DigitalPlotOffset);
          in = (int)IVar8.x;
          pixY_Offset = (int)(pIVar3->PixelRange[itemData1.y._4_4_].Min.y +
                             (float)(((-(int)fVar2 - pIVar3->DigitalPlotOffset) - (int)rhs) + -0x14)
                             );
          while( true ) {
            bVar4 = false;
            if (itemData2.y._4_4_ + 2 < getter.Count) {
              bVar4 = itemData1.x == itemData2.x;
            }
            if (!bVar4) break;
            _pixY_1_float = GetterXsYs<signed_char>::operator()(&getter,itemData2.y._4_4_ + 1);
            local_88 = pixY_1_float._8_8_;
            bVar4 = ImNanOrInf(local_88);
            if (bVar4) break;
            IVar8 = PlotToPixels((ImPlotPoint *)&pixY_1_float,-1);
            local_98 = IVar8.x;
            in = (int)local_98;
            itemData2.y._4_4_ = itemData2.y._4_4_ + 1;
          }
          if (pMax.x < pIVar3->PixelRange[itemData1.y._4_4_].Min.x) {
            pMax.x = pIVar3->PixelRange[itemData1.y._4_4_].Min.x;
          }
          if ((float)in < pIVar3->PixelRange[itemData1.y._4_4_].Min.x) {
            in = (int)pIVar3->PixelRange[itemData1.y._4_4_].Min.x;
          }
          pIVar1 = &pIVar3->PixelRange[itemData1.y._4_4_].Max;
          if (pIVar1->x <= pMax.x && pMax.x != pIVar1->x) {
            pMax.x = pIVar3->PixelRange[itemData1.y._4_4_].Max.x;
          }
          pIVar1 = &pIVar3->PixelRange[itemData1.y._4_4_].Max;
          if (pIVar1->x <= (float)in && (float)in != pIVar1->x) {
            in = (int)pIVar3->PixelRange[itemData1.y._4_4_].Max.x;
          }
          if ((pMax.x < (float)in) &&
             ((bVar4 = ImRect::Contains(&pIVar3->CurrentPlot->PlotRect,&pMax), bVar4 ||
              (bVar4 = ImRect::Contains(&pIVar3->CurrentPlot->PlotRect,(ImVec2 *)&in), bVar4)))) {
            col = ImGui::GetColorU32(pIVar5->Colors + 1);
            ImDrawList::AddRectFilled(this,&pMax,(ImVec2 *)&in,col,0.0,0xf);
          }
        }
        _auStack_40 = _pixY_1_float;
      }
      pIVar3->DigitalPlotItemCnt = pIVar3->DigitalPlotItemCnt + 1;
      pIVar3->DigitalPlotOffset = itemData1.y._0_4_ + pIVar3->DigitalPlotOffset;
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotDigitalEx(const char* label_id, Getter getter) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        ImPlotContext& gp = *GImPlot;
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImPlotNextItemData& s = GetItemData();
        if (getter.Count > 1 && s.RenderFill) {
            const int y_axis = GetCurrentYAxis();
            int pixYMax = 0;
            ImPlotPoint itemData1 = getter(0);
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint itemData2 = getter(i);
                if (ImNanOrInf(itemData1.y)) {
                    itemData1 = itemData2;
                    continue;
                }
                if (ImNanOrInf(itemData2.y)) itemData2.y = ImConstrainNan(ImConstrainInf(itemData2.y));
                int pixY_0 = (int)(s.LineWeight);
                itemData1.y = ImMax(0.0, itemData1.y);
                float pixY_1_float = s.DigitalBitHeight * (float)itemData1.y;
                int pixY_1 = (int)(pixY_1_float); //allow only positive values
                int pixY_chPosOffset = (int)(ImMax(s.DigitalBitHeight, pixY_1_float) + s.DigitalBitGap);
                pixYMax = ImMax(pixYMax, pixY_chPosOffset);
                ImVec2 pMin = PlotToPixels(itemData1);
                ImVec2 pMax = PlotToPixels(itemData2);
                int pixY_Offset = 20; //20 pixel from bottom due to mouse cursor label
                pMin.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset)                   - pixY_Offset);
                pMax.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset) - pixY_0 - pixY_1 - pixY_Offset);
                //plot only one rectangle for same digital state
                while (((i+2) < getter.Count) && (itemData1.y == itemData2.y)) {
                    const int in = (i + 1);
                    itemData2 = getter(in);
                    if (ImNanOrInf(itemData2.y)) break;
                    pMax.x = PlotToPixels(itemData2).x;
                    i++;
                }
                //do not extend plot outside plot range
                if (pMin.x < gp.PixelRange[y_axis].Min.x) pMin.x = gp.PixelRange[y_axis].Min.x;
                if (pMax.x < gp.PixelRange[y_axis].Min.x) pMax.x = gp.PixelRange[y_axis].Min.x;
                if (pMin.x > gp.PixelRange[y_axis].Max.x) pMin.x = gp.PixelRange[y_axis].Max.x;
                if (pMax.x > gp.PixelRange[y_axis].Max.x) pMax.x = gp.PixelRange[y_axis].Max.x;
                //plot a rectangle that extends up to x2 with y1 height
                if ((pMax.x > pMin.x) && (gp.CurrentPlot->PlotRect.Contains(pMin) || gp.CurrentPlot->PlotRect.Contains(pMax))) {
                    // ImVec4 colAlpha = item->Color;
                    // colAlpha.w = item->Highlight ? 1.0f : 0.9f;
                    DrawList.AddRectFilled(pMin, pMax, ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]));
                }
                itemData1 = itemData2;
            }
            gp.DigitalPlotItemCnt++;
            gp.DigitalPlotOffset += pixYMax;
        }
        EndItem();
    }
}